

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void DeviceZXSpectrum512(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *this;
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  
  this = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(this,"ZXSPECTRUM512",parent);
  *dev = this;
  initZxLikeDevice(*dev,0x4000,0x20,initialPagesZx128,ramtop);
  return;
}

Assistant:

static void DeviceZXSpectrum512(CDevice **dev, CDevice *parent, aint ramtop) {
	*dev = new CDevice("ZXSPECTRUM512", parent);
	initZxLikeDevice(*dev, 0x4000, 32, initialPagesZx128, ramtop);
}